

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

void utext_setNativeIndex_63(UText *ut,int64_t index)

{
  int32_t iVar1;
  int iVar2;
  
  if ((index < ut->chunkNativeStart) || (ut->chunkNativeLimit <= index)) {
    (*ut->pFuncs->access)(ut,index,'\x01');
  }
  else {
    iVar2 = (int)index - (int)ut->chunkNativeStart;
    if (ut->nativeIndexingLimit < iVar2) {
      iVar1 = (*ut->pFuncs->mapNativeIndexToUTF16)(ut,index);
      ut->chunkOffset = iVar1;
    }
    else {
      ut->chunkOffset = iVar2;
    }
  }
  iVar2 = ut->chunkOffset;
  if ((iVar2 < ut->chunkLength) && ((ut->chunkContents[iVar2] & 0xfc00U) == 0xdc00)) {
    if (iVar2 == 0) {
      (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0');
    }
    iVar2 = ut->chunkOffset;
    if ((0 < (long)iVar2) && ((ut->chunkContents[(long)iVar2 + -1] & 0xfc00U) == 0xd800)) {
      ut->chunkOffset = iVar2 + -1;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utext_setNativeIndex(UText *ut, int64_t index) {
    if(index<ut->chunkNativeStart || index>=ut->chunkNativeLimit) {
        // The desired position is outside of the current chunk.
        // Access the new position.  Assume a forward iteration from here,
        // which will also be optimimum for a single random access.
        // Reverse iterations may suffer slightly.
        ut->pFuncs->access(ut, index, TRUE);
    } else if((int32_t)(index - ut->chunkNativeStart) <= ut->nativeIndexingLimit) {
        // utf-16 indexing.
        ut->chunkOffset=(int32_t)(index-ut->chunkNativeStart);
    } else {
         ut->chunkOffset=ut->pFuncs->mapNativeIndexToUTF16(ut, index);
    }
    // The convention is that the index must always be on a code point boundary.
    // Adjust the index position if it is in the middle of a surrogate pair.
    if (ut->chunkOffset<ut->chunkLength) {
        UChar c= ut->chunkContents[ut->chunkOffset];
        if (U16_IS_TRAIL(c)) {
            if (ut->chunkOffset==0) {
                ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE);
            }
            if (ut->chunkOffset>0) {
                UChar lead = ut->chunkContents[ut->chunkOffset-1];
                if (U16_IS_LEAD(lead)) {
                    ut->chunkOffset--;
                }
            }
        }
    }
}